

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QIcon __thiscall QCss::Declaration::iconValue(Declaration *this)

{
  int iVar1;
  bool bVar2;
  QPixmap *pQVar3;
  DeclarationData *pDVar4;
  qsizetype qVar5;
  const_reference pVVar6;
  QPixmap *pQVar7;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  int j;
  State state;
  Mode mode;
  Value *value;
  int i;
  QIcon *icon;
  QString uri;
  undefined4 in_stack_ffffffffffffff28;
  ImageConversionFlag in_stack_ffffffffffffff2c;
  QPixmap *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QPixmap *in_stack_ffffffffffffff40;
  QVariant *in_stack_ffffffffffffff48;
  QIconPrivate *this_00;
  int local_94;
  int local_80;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa33ff2);
  bVar2 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffff30);
  if (bVar2) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3400e);
    qvariant_cast<QIcon>(in_stack_ffffffffffffff48);
  }
  else {
    this_00->engine = (QIconEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon((QIcon *)this_00);
    local_80 = 0;
    do {
      pQVar3 = (QPixmap *)(long)local_80;
      pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa34059);
      qVar5 = QList<QCss::Value>::size(&pDVar4->values);
      if (qVar5 <= (long)pQVar3) break;
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3408f);
      pVVar6 = QList<QCss::Value>::at
                         ((QList<QCss::Value> *)in_stack_ffffffffffffff30,
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (pVVar6->type != Uri) break;
      ::QVariant::toString();
      iVar1 = local_80;
      for (local_94 = 0; local_80 = iVar1 + 1, local_94 < 2; local_94 = local_94 + 1) {
        in_stack_ffffffffffffff40 = (QPixmap *)(long)local_80;
        pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                           ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                            0xa34139);
        pQVar7 = (QPixmap *)QList<QCss::Value>::size(&pDVar4->values);
        if (in_stack_ffffffffffffff40 == pQVar7) break;
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa34160);
        pVVar6 = QList<QCss::Value>::at
                           ((QList<QCss::Value> *)in_stack_ffffffffffffff30,
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (pVVar6->type != KnownIdentifier) break;
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa34184);
        pVVar6 = QList<QCss::Value>::at
                           ((QList<QCss::Value> *)in_stack_ffffffffffffff30,
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff3c = ::QVariant::toInt((bool *)&pVVar6->variant);
        iVar1 = local_80;
      }
      bVar2 = QIcon::isNull((QIcon *)in_stack_ffffffffffffff30);
      if (bVar2) {
        QIcon::QIcon((QIcon *)in_stack_ffffffffffffff40,
                     (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QIcon::operator=((QIcon *)in_stack_ffffffffffffff40,
                         (QIcon *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QIcon::~QIcon((QIcon *)in_stack_ffffffffffffff30);
      }
      else {
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff2c);
        QPixmap::QPixmap(in_stack_ffffffffffffff40,
                         (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (char *)in_stack_ffffffffffffff30,
                         (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                         SUB84((ulong)pQVar3 >> 0x20,0));
        QIcon::addPixmap((QIcon *)this_00,pQVar3,(Mode)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (State)in_stack_ffffffffffffff40);
        QPixmap::~QPixmap(in_stack_ffffffffffffff30);
      }
      in_stack_ffffffffffffff30 = (QPixmap *)(long)local_80;
      pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa342e9);
      pQVar3 = (QPixmap *)QList<QCss::Value>::size(&pDVar4->values);
      if (in_stack_ffffffffffffff30 == pQVar3) {
        bVar2 = true;
      }
      else {
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa34316);
        pVVar6 = QList<QCss::Value>::at
                           ((QList<QCss::Value> *)in_stack_ffffffffffffff30,
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (pVVar6->type == TermOperatorComma) {
          local_80 = iVar1 + 2;
        }
        bVar2 = false;
      }
      QString::~QString((QString *)0xa3434c);
    } while (!bVar2);
    ::QVariant::fromValue<QIcon>
              ((QIcon *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa34379);
    ::QVariant::operator=
              ((QVariant *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (QVariant *)in_stack_ffffffffffffff30);
    ::QVariant::~QVariant(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QIcon Declaration::iconValue() const
{
    if (d->parsed.isValid())
        return qvariant_cast<QIcon>(d->parsed);

    QIcon icon;
    for (int i = 0; i < d->values.size();) {
        const Value &value = d->values.at(i++);
        if (value.type != Value::Uri)
            break;
        QString uri = value.variant.toString();
        QIcon::Mode mode = QIcon::Normal;
        QIcon::State state = QIcon::Off;
        for (int j = 0; j < 2; j++) {
            if (i != d->values.size() && d->values.at(i).type == Value::KnownIdentifier) {
                switch (d->values.at(i).variant.toInt()) {
                case Value_Disabled: mode = QIcon::Disabled; break;
                case Value_Active: mode = QIcon::Active; break;
                case Value_Selected: mode = QIcon::Selected; break;
                case Value_Normal: mode = QIcon::Normal; break;
                case Value_On: state = QIcon::On; break;
                case Value_Off: state = QIcon::Off; break;
                default: break;
                }
                ++i;
            } else {
                break;
            }
        }

        // QIcon is soo broken
        if (icon.isNull())
            icon = QIcon(uri);
        else
            icon.addPixmap(uri, mode, state);

        if (i == d->values.size())
            break;

        if (d->values.at(i).type == Value::TermOperatorComma)
            i++;
    }

    d->parsed = QVariant::fromValue<QIcon>(icon);
    return icon;
}